

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

bool __thiscall CFG::anon_unknown_11::Optimizer::IsEmpty(Optimizer *this,Expression *Code)

{
  bool bVar1;
  Block *pBVar2;
  Expression **ppEVar3;
  Expression *Item;
  Iterator __end3;
  Iterator __begin3;
  ExpressionList *__range3;
  Block *WasmBlock;
  Expression *Code_local;
  Optimizer *this_local;
  
  bVar1 = ::wasm::Expression::is<wasm::Nop>(Code);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    pBVar2 = ::wasm::Expression::dynCast<wasm::Block>(Code);
    if (pBVar2 == (Block *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      join_0x00000010_0x00000000_ =
           ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                     (&(pBVar2->list).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
      _Item = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                        (&(pBVar2->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
      while (bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator
                     ::operator!=((Iterator *)&__end3.index,(Iterator *)&Item), bVar1) {
        ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&__end3.index);
        bVar1 = IsEmpty(this,*ppEVar3);
        if (!bVar1) {
          return false;
        }
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                  ((Iterator *)&__end3.index);
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool IsEmpty(wasm::Expression* Code) {
    if (Code->is<wasm::Nop>()) {
      return true; // a nop
    }
    if (auto* WasmBlock = Code->dynCast<wasm::Block>()) {
      for (auto* Item : WasmBlock->list) {
        if (!IsEmpty(Item)) {
          return false;
        }
      }
      return true; // block with no non-empty contents
    }
    return false;
  }